

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

int64_t av1_model_rd_for_sb_uv
                  (AV1_COMP *cpi,BLOCK_SIZE plane_bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                  RD_STATS *this_rdc,int start_plane,int stop_plane)

{
  int64_t *dist_00;
  long lVar1;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  int *in_R8;
  uint in_R9D;
  uint var;
  BLOCK_SIZE bs;
  uint32_t ac_quant;
  uint32_t dc_quant;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int64_t tot_sse;
  int plane;
  int64_t dist;
  int rate;
  uint sse;
  int *rate_00;
  uint in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  int local_34;
  uint local_30 [2];
  int *local_28;
  long local_20;
  long local_18;
  byte local_9;
  long *local_8;
  
  rate_00 = (int *)0x0;
  *in_R8 = 0;
  in_R8[2] = 0;
  in_R8[3] = 0;
  *(undefined1 *)(in_R8 + 8) = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_9 = in_SIL;
  local_8 = in_RDI;
  for (; (int)in_R9D <= (int)var; in_R9D = in_R9D + 1) {
    dist_00 = (int64_t *)(local_18 + (long)(int)in_R9D * 0x88);
    lVar1 = local_20 + 0x10 + (long)(int)in_R9D * 0xa30;
    if (*(char *)(local_18 + 0x25626 + (long)(int)(in_R9D - 1)) != '\0') {
      (**(code **)(*local_8 + (ulong)local_9 * 0x70 + 0xc918))
                (dist_00[6],(int)dist_00[9],*(undefined8 *)(lVar1 + 0x10),
                 *(undefined4 *)(lVar1 + 0x28),local_30);
      rate_00 = (int *)((ulong)local_30[0] + (long)rate_00);
      av1_model_rd_from_var_lapndz
                (in_stack_ffffffffffffffc0,in_R9D,in_stack_ffffffffffffffb8,rate_00,dist_00);
      *local_28 = (local_34 >> 1) + *local_28;
      *(int64_t *)(local_28 + 2) = in_stack_ffffffffffffffc0 * 8 + *(long *)(local_28 + 2);
      av1_model_rd_from_var_lapndz
                (in_stack_ffffffffffffffc0,in_R9D,in_stack_ffffffffffffffb8,rate_00,dist_00);
      *local_28 = local_34 + *local_28;
      *(int64_t *)(local_28 + 2) = in_stack_ffffffffffffffc0 * 0x10 + *(long *)(local_28 + 2);
    }
  }
  if (*local_28 == 0) {
    *(undefined1 *)(local_28 + 8) = 1;
  }
  if ((long)rate_00 * 0x800 <=
      ((long)*local_28 * (long)*(int *)(local_18 + 0x4218) + 0x100 >> 9) +
      *(long *)(local_28 + 2) * 0x80) {
    *local_28 = 0;
    *(long *)(local_28 + 2) = (long)rate_00 << 4;
    *(undefined1 *)(local_28 + 8) = 1;
  }
  return (int64_t)rate_00;
}

Assistant:

int64_t av1_model_rd_for_sb_uv(AV1_COMP *cpi, BLOCK_SIZE plane_bsize,
                               MACROBLOCK *x, MACROBLOCKD *xd,
                               RD_STATS *this_rdc, int start_plane,
                               int stop_plane) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  int rate;
  int64_t dist;
  int plane;
  int64_t tot_sse = 0;

  this_rdc->rate = 0;
  this_rdc->dist = 0;
  this_rdc->skip_txfm = 0;

  for (plane = start_plane; plane <= stop_plane; ++plane) {
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const uint32_t dc_quant = p->dequant_QTX[0];
    const uint32_t ac_quant = p->dequant_QTX[1];
    const BLOCK_SIZE bs = plane_bsize;
    unsigned int var;
    if (!x->color_sensitivity[COLOR_SENS_IDX(plane)]) continue;

    var = cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, pd->dst.buf,
                                  pd->dst.stride, &sse);
    assert(sse >= var);
    tot_sse += sse;

    av1_model_rd_from_var_lapndz(sse - var, num_pels_log2_lookup[bs],
                                 dc_quant >> 3, &rate, &dist);

    this_rdc->rate += rate >> 1;
    this_rdc->dist += dist << 3;

    av1_model_rd_from_var_lapndz(var, num_pels_log2_lookup[bs], ac_quant >> 3,
                                 &rate, &dist);

    this_rdc->rate += rate;
    this_rdc->dist += dist << 4;
  }

  if (this_rdc->rate == 0) {
    this_rdc->skip_txfm = 1;
  }

  if (RDCOST(x->rdmult, this_rdc->rate, this_rdc->dist) >=
      RDCOST(x->rdmult, 0, tot_sse << 4)) {
    this_rdc->rate = 0;
    this_rdc->dist = tot_sse << 4;
    this_rdc->skip_txfm = 1;
  }

  return tot_sse;
}